

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abort.cpp
# Opt level: O3

void node::AbortNode(SignalInterrupt *shutdown,atomic<int> *exit_status,bilingual_str *message,
                    Warnings *warnings)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bilingual_str message_00;
  bool bVar4;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  _Move_assign_alias<kernel::Warning,_node::Warning> in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  _Alloc_hider in_stack_ffffffffffffff08;
  _Alloc_hider _Var5;
  size_type in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff18;
  undefined1 uVar6;
  undefined7 in_stack_ffffffffffffff19;
  undefined8 in_stack_ffffffffffffff20;
  _Alloc_hider in_stack_ffffffffffffff28;
  _Alloc_hider _Var7;
  size_type in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff38;
  undefined1 uVar8;
  undefined7 in_stack_ffffffffffffff39;
  bilingual_str local_b8;
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (warnings != (Warnings *)0x0) {
    pcVar3 = (message->original)._M_dataplus._M_p;
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,pcVar3,pcVar3 + (message->original)._M_string_length);
    pcVar3 = (message->translated)._M_dataplus._M_p;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar3,pcVar3 + (message->translated)._M_string_length);
    message_00.original._M_string_length = (size_type)in_stack_ffffffffffffff08._M_p;
    message_00.original._M_dataplus._M_p = in_stack_ffffffffffffff00;
    message_00.original.field_2._M_allocated_capacity = in_stack_ffffffffffffff10;
    message_00.original.field_2._M_local_buf[8] = in_stack_ffffffffffffff18;
    message_00.original.field_2._9_7_ = in_stack_ffffffffffffff19;
    message_00.translated._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff20;
    message_00.translated._M_string_length = (size_type)in_stack_ffffffffffffff28._M_p;
    message_00.translated.field_2._M_allocated_capacity = in_stack_ffffffffffffff30;
    message_00.translated.field_2._M_local_buf[8] = in_stack_ffffffffffffff38;
    message_00.translated.field_2._9_7_ = in_stack_ffffffffffffff39;
    Warnings::Set(warnings,(warning_type)
                           in_stack_fffffffffffffef8.
                           super__Copy_assign_alias<kernel::Warning,_node::Warning>.
                           super__Move_ctor_alias<kernel::Warning,_node::Warning>.
                           super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
                           super__Variant_storage_alias<kernel::Warning,_node::Warning>,message_00);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
  }
  _Var5._M_p = (pointer)&stack0xffffffffffffff18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff08,
             "A fatal internal error occurred, see debug.log for details: ","");
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    in_stack_ffffffffffffff28._M_p = (pointer)&stack0xffffffffffffff38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffff28,
               "A fatal internal error occurred, see debug.log for details: ","");
  }
  else {
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff28,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
               (char **)&stack0xffffffffffffff00);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff08,(message->original)._M_dataplus._M_p,
             (message->original)._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff28,(message->translated)._M_dataplus._M_p,
             (message->translated)._M_string_length);
  paVar1 = &local_b8.original.field_2;
  local_b8.original._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&stack0xffffffffffffff18) {
    local_b8.original._M_dataplus._M_p = _Var5._M_p;
  }
  local_b8.original.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffff19;
  local_b8.original.field_2._M_local_buf[0] = in_stack_ffffffffffffff18;
  paVar2 = &local_b8.translated.field_2;
  uVar6 = '\0';
  local_b8.translated._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_ffffffffffffff28._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&stack0xffffffffffffff38) {
    local_b8.translated._M_dataplus._M_p = in_stack_ffffffffffffff28._M_p;
  }
  local_b8.translated.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffff39;
  local_b8.translated.field_2._M_local_buf[0] = in_stack_ffffffffffffff38;
  uVar8 = '\0';
  _Var5._M_p = (pointer)&stack0xffffffffffffff18;
  _Var7._M_p = (pointer)&stack0xffffffffffffff38;
  InitError(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.translated._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8.translated._M_dataplus._M_p,
                    local_b8.translated.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.original._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8.original._M_dataplus._M_p,
                    local_b8.original.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&stack0xffffffffffffff38) {
    operator_delete(_Var7._M_p,CONCAT71(in_stack_ffffffffffffff39,uVar8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&stack0xffffffffffffff18) {
    operator_delete(_Var5._M_p,CONCAT71(in_stack_ffffffffffffff19,uVar6) + 1);
  }
  LOCK();
  (exit_status->super___atomic_base<int>)._M_i = 1;
  UNLOCK();
  if ((shutdown != (SignalInterrupt *)0x0) &&
     (bVar4 = util::SignalInterrupt::operator()(shutdown), !bVar4)) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/abort.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "AbortNode";
    logging_function._M_len = 9;
    LogPrintFormatInternal<>
              (logging_function,source_file,0x18,ALL,Error,(ConstevalFormatString<0U>)0xf7dffe);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AbortNode(util::SignalInterrupt* shutdown, std::atomic<int>& exit_status, const bilingual_str& message, node::Warnings* warnings)
{
    if (warnings) warnings->Set(Warning::FATAL_INTERNAL_ERROR, message);
    InitError(_("A fatal internal error occurred, see debug.log for details: ") + message);
    exit_status.store(EXIT_FAILURE);
    if (shutdown && !(*shutdown)()) {
        LogError("Failed to send shutdown signal\n");
    };
}